

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O0

void __thiscall BigInteger::_divide(BigInteger *this,int a,int *remainder)

{
  bool bVar1;
  undefined8 uVar2;
  reference puVar3;
  undefined1 *puVar4;
  undefined4 *in_RDX;
  int in_ESI;
  long in_RDI;
  reverse_iterator i;
  longlong carry;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_ffffffffffffff98;
  BigInteger *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb0;
  long local_30;
  int local_c;
  
  if (in_ESI == 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    zero_division_error::runtime_error
              ((zero_division_error *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    __cxa_throw(uVar2,&zero_division_error::typeinfo,zero_division_error::~zero_division_error);
  }
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(in_stack_ffffffffffffffb0)
  ;
  if (bVar1) {
    *in_RDX = 0;
  }
  else {
    local_c = in_ESI;
    if (in_ESI < 0) {
      *(bool *)(in_RDI + 0x18) = (*(byte *)(in_RDI + 0x18) & 1) != 1;
      local_c = -in_ESI;
    }
    local_30 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rbegin
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    while( true ) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rend
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (!bVar1) break;
      in_stack_ffffffffffffffa0 = (BigInteger *)(local_30 * 1000000000);
      puVar3 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)in_stack_ffffffffffffffa0);
      puVar4 = (undefined1 *)
               ((long)&(in_stack_ffffffffffffffa0->digits).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start + (ulong)*puVar3);
      in_stack_ffffffffffffffac = (uint)((long)puVar4 / (long)local_c);
      puVar3 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)in_stack_ffffffffffffffa0);
      *puVar3 = in_stack_ffffffffffffffac;
      local_30 = (long)puVar4 % (long)local_c;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)in_stack_ffffffffffffffa0);
    }
    *in_RDX = (int)local_30;
    normalize(in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void BigInteger::_divide(int a, int &remainder)
{
    if(!a)
        throw zero_division_error("Integer division by zero");
    if(digits.empty())
    {
        remainder = 0;
        return;
    }
    if(a < 0)
    {
        negative ^= 1;
        a = -a;
    }
    long long carry = 0;
    for(auto i = digits.rbegin(); i != digits.rend(); ++i)
    {
        carry = carry * BLOCK_MOD + *i;
        *i = carry / a;
        carry %= a;
    }
    remainder = static_cast<int>(carry);
    normalize();
}